

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

void __thiscall
Js::IntlEngineInterfaceExtensionObject::cleanUpIntl
          (IntlEngineInterfaceExtensionObject *this,ScriptContext *scriptContext,
          DynamicObject *intlObject)

{
  BOOL BVar1;
  
  (this->numberToLocaleString).ptr = (JavascriptFunction *)0x0;
  (this->stringLocaleCompare).ptr = (JavascriptFunction *)0x0;
  (this->dateToLocaleTimeString).ptr = (JavascriptFunction *)0x0;
  (this->dateToLocaleDateString).ptr = (JavascriptFunction *)0x0;
  (this->dateToLocaleString).ptr = (JavascriptFunction *)0x0;
  BVar1 = JavascriptOperators::HasProperty(&intlObject->super_RecyclableObject,0x24b);
  if (BVar1 != 0) {
    (*(intlObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x21])(intlObject,0x24b,0);
  }
  BVar1 = JavascriptOperators::HasProperty(&intlObject->super_RecyclableObject,0x232);
  if (BVar1 != 0) {
    (*(intlObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x21])(intlObject,0x232,0);
  }
  BVar1 = JavascriptOperators::HasProperty(&intlObject->super_RecyclableObject,0x256);
  if (BVar1 != 0) {
    (*(intlObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x21])(intlObject,0x256,0);
    return;
  }
  return;
}

Assistant:

void IntlEngineInterfaceExtensionObject::cleanUpIntl(ScriptContext *scriptContext, DynamicObject* intlObject)
    {
        this->dateToLocaleString = nullptr;
        this->dateToLocaleTimeString = nullptr;
        this->dateToLocaleDateString = nullptr;
        this->numberToLocaleString = nullptr;
        this->stringLocaleCompare = nullptr;

        //Failed to setup Intl; Windows.Globalization.dll is most likely missing.
        if (Js::JavascriptOperators::HasProperty(intlObject, Js::PropertyIds::Collator))
        {
            intlObject->DeleteProperty(Js::PropertyIds::Collator, Js::PropertyOperationFlags::PropertyOperation_None);
        }
        if (Js::JavascriptOperators::HasProperty(intlObject, Js::PropertyIds::NumberFormat))
        {
            intlObject->DeleteProperty(Js::PropertyIds::NumberFormat, Js::PropertyOperationFlags::PropertyOperation_None);
        }
        if (Js::JavascriptOperators::HasProperty(intlObject, Js::PropertyIds::DateTimeFormat))
        {
            intlObject->DeleteProperty(Js::PropertyIds::DateTimeFormat, Js::PropertyOperationFlags::PropertyOperation_None);
        }
    }